

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int32_t al_ustr_get(ALLEGRO_USTR *ub,int pos)

{
  int errnum;
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  if (ub == (ALLEGRO_USTR *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    if (0 < ub->slen) {
      uVar8 = ub->slen;
    }
  }
  iVar4 = -1;
  uVar3 = 0xffffffff;
  if ((uint)pos < uVar8) {
    uVar3 = (uint)ub->data[(uint)pos];
  }
  if ((int)uVar3 < 0) {
    errnum = 0x22;
  }
  else {
    if ((int)uVar3 < 0x80) {
      return uVar3;
    }
    iVar4 = -2;
    errnum = 0x54;
    if (0xc1 < (int)uVar3) {
      if ((int)uVar3 < 0xe0) {
        iVar6 = 0x80;
        iVar2 = 1;
        uVar8 = 0x1f;
      }
      else if ((int)uVar3 < 0xf0) {
        iVar6 = 0x800;
        iVar2 = 2;
        uVar8 = 0xf;
      }
      else {
        if (0xf4 < (int)uVar3) goto LAB_00181c64;
        iVar6 = 0x10000;
        iVar2 = 3;
        uVar8 = 7;
      }
      if (ub == (ALLEGRO_USTR *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        if (0 < ub->slen) {
          iVar5 = ub->slen;
        }
      }
      if (iVar2 + pos <= iVar5) {
        if (ub == (ALLEGRO_USTR *)0x0) {
          puVar1 = (uchar *)0x0;
        }
        else {
          puVar1 = ub->data;
        }
        uVar3 = uVar3 & uVar8;
        lVar7 = 0;
        while (iVar2 != (int)lVar7) {
          uVar8 = puVar1[lVar7 + (long)pos + 1] & 0xffffffc0;
          if (uVar8 == 0x80) {
            uVar3 = uVar3 << 6 | puVar1[lVar7 + (long)pos + 1] & 0x3f;
          }
          else {
            al_set_errno(0x54);
          }
          lVar7 = lVar7 + 1;
          if (uVar8 != 0x80) {
            return -2;
          }
        }
        errnum = 0x54;
        if (iVar6 <= (int)uVar3) {
          return uVar3;
        }
      }
    }
  }
LAB_00181c64:
  al_set_errno(errnum);
  return iVar4;
}

Assistant:

int32_t al_ustr_get(const ALLEGRO_USTR *ub, int pos)
{
   int32_t c;
   int remain;
   int32_t minc;
   const unsigned char *data;

   c = _al_bchare(ub, pos, -1);

   if (c < 0) {
      /* Out of bounds. */
      al_set_errno(ERANGE);
      return -1;
   }

   if (c <= 0x7F) {
      /* Plain ASCII. */
      return c;
   }

   if (c <= 0xC1) {
      /* Trailing byte of multi-byte sequence or an overlong encoding for
       * code point <= 127.
       */
      al_set_errno(EILSEQ);
      return -2;
   }

   if (c <= 0xDF) {
      /* 2-byte sequence. */
      c &= 0x1F;
      remain = 1;
      minc = 0x80;
   }
   else if (c <= 0xEF) {
      /* 3-byte sequence. */
      c &= 0x0F;
      remain = 2;
      minc = 0x800;
   }
   else if (c <= 0xF4) {
      /* 4-byte sequence. */
      c &= 0x07;
      remain = 3;
      minc = 0x10000;
   }
   else {
      /* Otherwise invalid. */
      al_set_errno(EILSEQ);
      return -2;
   }

   if (pos + remain > _al_blength(ub)) {
      al_set_errno(EILSEQ);
      return -2;
   }

   data = (const unsigned char *) _al_bdata(ub);
   while (remain--) {
      int d = data[++pos];

      if (!IS_TRAIL_BYTE(d)) {
         al_set_errno(EILSEQ);
         return -2;
      }

      c = (c << 6) | (d & 0x3F);
   }

   /* Check for overlong forms, which could be used to bypass security
    * validations.  We could also check code points aren't above U+10FFFF or in
    * the surrogate ranges, but we don't.
    */

   if (c < minc) {
      al_set_errno(EILSEQ);
      return -2;
   }

   return c;
}